

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Subpackage * __thiscall
google::protobuf::DescriptorPool::Tables::Allocate<google::protobuf::Symbol::Subpackage>
          (Tables *this)

{
  Subpackage *pSVar1;
  
  pSVar1 = (Subpackage *)AllocateBytes(this,0x10);
  (pSVar1->super_SymbolBase).symbol_type_ = '\0';
  pSVar1->name_size = 0;
  pSVar1->file = (FileDescriptor *)0x0;
  return pSVar1;
}

Assistant:

Type* DescriptorPool::Tables::Allocate() {
  static_assert(std::is_trivially_destructible<Type>::value, "");
  static_assert(alignof(Type) <= 8, "");
  return ::new (AllocateBytes(sizeof(Type))) Type{};
}